

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fair_mutex.hpp
# Opt level: O0

void __thiscall yamc::fair::recursive_timed_mutex::lock(recursive_timed_mutex *this)

{
  bool bVar1;
  undefined1 local_28 [8];
  unique_lock<std::mutex> lk;
  id tid;
  mutex *this_local;
  
  lk._8_8_ = std::this_thread::get_id();
  detail::timed_mutex_impl::internal_lock((timed_mutex_impl *)local_28);
  bVar1 = std::operator==((id)*(native_handle_type *)(this + 8),(id)lk._8_8_);
  if (bVar1) {
    if (*(long *)this == 0) {
      __assert_fail("0 < ncount_",
                    "/workspace/llm4binary/github/license_c_cmakelists/yohhoy[P]yamc/include/fair_mutex.hpp"
                    ,0x147,"void yamc::fair::recursive_timed_mutex::lock()");
    }
    *(long *)this = *(long *)this + 1;
  }
  else {
    detail::timed_mutex_impl::impl_lock
              ((timed_mutex_impl *)(this + 0x10),(unique_lock<std::mutex> *)local_28);
    *(undefined8 *)this = 1;
    *(undefined8 *)(this + 8) = lk._8_8_;
  }
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_28);
  return;
}

Assistant:

void lock()
  {
    const auto tid = std::this_thread::get_id();
    auto lk = impl_.internal_lock();
    if (owner_ == tid) {
      assert(0 < ncount_);
      ++ncount_;
    } else {
      impl_.impl_lock(lk);
      ncount_ = 1;
      owner_ = tid;
    }
  }